

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall Equality_clone_Test::~Equality_clone_Test(Equality_clone_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, clone)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/outsidecomponentequivalentvariables.xml"));
    auto clonedModel = model->clone();
    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("modelflattening/"));
    model = importer->flattenModel(model);

    importer->resolveImports(clonedModel, resourcePath("modelflattening/"));
    clonedModel = importer->flattenModel(clonedModel);

    EXPECT_TRUE(model->equals(clonedModel));
    EXPECT_TRUE(clonedModel->equals(model));
}